

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O3

DOMNodeIteratorImpl * __thiscall
xercesc_4_0::DOMNodeIteratorImpl::operator=(DOMNodeIteratorImpl *this,DOMNodeIteratorImpl *other)

{
  DOMNode *pDVar1;
  
  pDVar1 = other->fRoot;
  this->fRoot = pDVar1;
  this->fCurrentNode = pDVar1;
  this->fWhatToShow = other->fWhatToShow;
  this->fNodeFilter = other->fNodeFilter;
  this->fForward = other->fForward;
  this->fDetached = other->fDetached;
  this->fExpandEntityReferences = other->fExpandEntityReferences;
  this->fDocument = other->fDocument;
  return this;
}

Assistant:

DOMNodeIteratorImpl& DOMNodeIteratorImpl::operator= (const DOMNodeIteratorImpl& other) {
    fRoot                   = other.fRoot;
    fCurrentNode            = other.fRoot;
    fWhatToShow             = other.fWhatToShow;
    fNodeFilter             = other.fNodeFilter;
    fForward                = other.fForward;
    fDetached               = other.fDetached;
    fExpandEntityReferences = other.fExpandEntityReferences;
    fDocument               = other.fDocument;
    return *this;
}